

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamSequence.cpp
# Opt level: O1

void __thiscall BamTools::SamSequence::Clear(SamSequence *this)

{
  (this->AssemblyID)._M_string_length = 0;
  *(this->AssemblyID)._M_dataplus._M_p = '\0';
  (this->Checksum)._M_string_length = 0;
  *(this->Checksum)._M_dataplus._M_p = '\0';
  (this->Length)._M_string_length = 0;
  *(this->Length)._M_dataplus._M_p = '\0';
  (this->Name)._M_string_length = 0;
  *(this->Name)._M_dataplus._M_p = '\0';
  (this->Species)._M_string_length = 0;
  *(this->Species)._M_dataplus._M_p = '\0';
  (this->URI)._M_string_length = 0;
  *(this->URI)._M_dataplus._M_p = '\0';
  std::vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>::
  _M_erase_at_end(&this->CustomTags,
                  (this->CustomTags).
                  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void SamSequence::Clear()
{
    AssemblyID.clear();
    Checksum.clear();
    Length.clear();
    Name.clear();
    Species.clear();
    URI.clear();
    CustomTags.clear();
}